

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O3

void __thiscall
gmath::OrthoCamera::reconstructRay(OrthoCamera *this,Vector3d *V,Vector3d *C,Vector2d *p)

{
  double dVar1;
  int i_1;
  Matrix33d *pMVar2;
  int k;
  long lVar3;
  int i;
  long lVar4;
  SVector<double,_3> ret;
  double local_18 [3];
  
  pMVar2 = &(this->super_Camera).R;
  local_18[0] = 0.0;
  local_18[1] = 0.0;
  local_18[2] = -1.0;
  ret.v[0] = 0.0;
  ret.v[1] = 0.0;
  ret.v[2] = 0.0;
  lVar3 = 0;
  do {
    dVar1 = ret.v[lVar3];
    lVar4 = 0;
    do {
      dVar1 = dVar1 + pMVar2->v[0][lVar4] * local_18[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
    ret.v[lVar3] = dVar1;
    lVar3 = lVar3 + 1;
    pMVar2 = (Matrix33d *)(pMVar2->v + 1);
  } while (lVar3 != 3);
  V->v[2] = ret.v[2];
  V->v[0] = ret.v[0];
  V->v[1] = ret.v[1];
  C->v[0] = *(double *)p * this->res;
  C->v[1] = -*(double *)(p + 8) * this->res;
  C->v[2] = 0.0;
  lVar3 = 0;
  do {
    C->v[lVar3] = (this->super_Camera).T.v[lVar3] + C->v[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return;
}

Assistant:

const Matrix33d &getR() const { return R; }